

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O3

bool __thiscall SessionObjectStore::deleteObject(SessionObjectStore *this,SessionObject *object)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_header *p_Var4;
  pair<std::_Rb_tree_iterator<SessionObject_*>,_std::_Rb_tree_iterator<SessionObject_*>_> pVar5;
  MutexLocker lock;
  SessionObject *local_38;
  MutexLocker local_30;
  
  local_38 = object;
  MutexLocker::MutexLocker(&local_30,this->storeMutex);
  p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var4 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var4->_M_header;
    do {
      if (*(SessionObject **)(p_Var1 + 1) >= object) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(SessionObject **)(p_Var1 + 1) < object];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && (*(SessionObject **)(p_Var2 + 1) <= object)) {
      SessionObject::invalidate(object);
      pVar5 = std::
              _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
              ::equal_range(&(this->objects)._M_t,&local_38);
      bVar3 = true;
      std::
      _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
      ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar5.first._M_node,
                     (_Base_ptr)pVar5.second._M_node);
      goto LAB_0016e4be;
    }
  }
  bVar3 = false;
  softHSMLog(3,"deleteObject",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObjectStore.cpp"
             ,0x88,"Cannot delete non-existent object 0x%08X",object);
LAB_0016e4be:
  MutexLocker::~MutexLocker(&local_30);
  return bVar3;
}

Assistant:

bool SessionObjectStore::deleteObject(SessionObject* object)
{
	MutexLocker lock(storeMutex);

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	object->invalidate();

	objects.erase(object);

	return true;
}